

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::stencilFuncSeparate
          (ReferenceContext *this,deUint32 face,deUint32 func,int ref,deUint32 mask)

{
  ulong uVar1;
  deUint32 *pdVar2;
  
  if ((((func & 0xfffffff8) == 0x200) && (face - 0x404 < 5)) &&
     ((0x13U >> (face - 0x404 & 0x1f) & 1) != 0)) {
    pdVar2 = &this->m_stencil[0].opMask;
    uVar1 = 0;
    do {
      if ((uVar1 & 1) == 0) {
        if ((face == 0x404) || (face == 0x408)) goto LAB_008288e0;
        if (uVar1 == 1) goto LAB_008288be;
      }
      else {
LAB_008288be:
        if ((face == 0x408) || (face == 0x405)) {
LAB_008288e0:
          ((StencilState *)(pdVar2 + -2))->func = func;
          pdVar2[-1] = ref;
          *pdVar2 = mask;
        }
      }
      uVar1 = uVar1 + 1;
      pdVar2 = pdVar2 + 7;
    } while (uVar1 == 1);
  }
  else if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
    return;
  }
  return;
}

Assistant:

static bool isValidCompareFunc (deUint32 func)
{
	switch (func)
	{
		case GL_NEVER:
		case GL_LESS:
		case GL_LEQUAL:
		case GL_GREATER:
		case GL_GEQUAL:
		case GL_EQUAL:
		case GL_NOTEQUAL:
		case GL_ALWAYS:
			return true;

		default:
			return false;
	}
}